

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

string * __thiscall
helics::FederateState::processQueryActual_abi_cxx11_(FederateState *this,string_view query)

{
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  basic_string_view<char,_std::char_traits<char>_> __args;
  initializer_list_t init_02;
  initializer_list_t init_03;
  initializer_list_t init_04;
  basic_string_view<char,_std::char_traits<char>_> __args_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_17;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_18;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  basic_string_view<char,_std::char_traits<char>_> __x_15;
  basic_string_view<char,_std::char_traits<char>_> __x_16;
  basic_string_view<char,_std::char_traits<char>_> __x_17;
  basic_string_view<char,_std::char_traits<char>_> __x_18;
  string_view jsonString;
  string_view request;
  bool bVar1;
  int iVar2;
  pointer pIVar3;
  ostream *poVar4;
  reference pvVar5;
  pointer this_00;
  pointer pTVar6;
  reference this_01;
  reference this_02;
  char *in_RCX;
  size_t in_RDX;
  FederateState *in_RSI;
  string *in_RDI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tag_3;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *queryCallback_1;
  const_iterator __end2_6;
  const_iterator __begin2_6;
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  *__range2_6;
  GlobalFederateId *dep_1;
  iterator __end2_5;
  iterator __begin2_5;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *__range2_5;
  GlobalFederateId *dep;
  iterator __end2_4;
  iterator __begin2_4;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *__range2_4;
  json base_10;
  json base_9;
  json base_8;
  json base_7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tag_2;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_3;
  string_view keyTag;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tag_1;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_2;
  json tagBlock_1;
  invalid_argument *anon_var_0;
  json json;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> potential;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *queryCallback;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  *__range3_2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tag;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3_1;
  json tagBlock;
  json base_6;
  json base_5;
  json base_4;
  json base_3;
  json base_2;
  json br1;
  pair<TimeRepresentation<count_time<9,_long>_>,_int> *barrier;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
  *__range2_1;
  json base_1;
  json base;
  GlobalHandle *isrc;
  iterator __end3;
  iterator __begin3;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *__range3;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *ipt;
  const_iterator __end2;
  const_iterator __begin2;
  shared_handle *__range2;
  shared_handle ipts;
  ostringstream subs;
  string qres;
  anon_class_8_1_8991fb9c addHeader;
  __string_type *str;
  TimeCoordinator *in_stack_fffffffffffff318;
  FederateState *in_stack_fffffffffffff320;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_fffffffffffff328;
  char __c;
  undefined4 in_stack_fffffffffffff330;
  BaseType in_stack_fffffffffffff334;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff338;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff340;
  string *in_stack_fffffffffffff348;
  FederateState *in_stack_fffffffffffff350;
  undefined4 in_stack_fffffffffffff358;
  BaseType in_stack_fffffffffffff35c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff360;
  char *in_stack_fffffffffffff368;
  char *key;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff370;
  string *in_stack_fffffffffffff378;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *val;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff380;
  JsonErrorCodes code;
  key_type *in_stack_fffffffffffff388;
  LogBuffer *in_stack_fffffffffffff390;
  char *in_stack_fffffffffffff398;
  undefined4 in_stack_fffffffffffff3d8;
  undefined4 in_stack_fffffffffffff3dc;
  json *in_stack_fffffffffffff3e0;
  json *in_stack_fffffffffffff3e8;
  undefined7 in_stack_fffffffffffff3f0;
  undefined1 in_stack_fffffffffffff3f7;
  json *in_stack_fffffffffffff468;
  FederateState *in_stack_fffffffffffff470;
  json *in_stack_fffffffffffff478;
  TimeCoordinator *in_stack_fffffffffffff480;
  allocator<char> local_a59 [33];
  __sv_type local_a38;
  json *in_stack_fffffffffffff5d8;
  InterfaceInfo *in_stack_fffffffffffff5e0;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_a08;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_a00;
  size_t local_9f8;
  char *pcStack_9f0;
  byte local_9e1;
  reference local_9e0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *local_9d8;
  __normal_iterator<const_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  local_9d0;
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  *local_9c8;
  BaseType local_9bc;
  undefined8 in_stack_fffffffffffff648;
  undefined8 in_stack_fffffffffffff650;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  local_998;
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  *in_stack_fffffffffffff670;
  undefined8 in_stack_fffffffffffff678;
  undefined8 in_stack_fffffffffffff680;
  undefined8 in_stack_fffffffffffff688;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_970 [2];
  BaseType local_94c;
  GlobalFederateId *local_938;
  GlobalFederateId *local_930;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  local_928;
  undefined1 local_920 [24];
  undefined1 *local_908;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_900;
  char local_8f0 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_8e0 [5];
  baseType local_890;
  double local_888;
  json *in_stack_fffffffffffff7a8;
  InterfaceInfo *in_stack_fffffffffffff7b0;
  undefined1 local_7b8 [40];
  size_t local_790;
  char *local_788;
  allocator<char> local_779;
  __sv_type local_778;
  size_t local_768;
  char *local_760;
  reference local_758;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_750;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_748 [2];
  basic_string_view<char,_std::char_traits<char>_> local_738 [4];
  reference local_6f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_6f0;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_6e8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_6e0;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_6d8 [3];
  size_t local_6a8;
  char *local_6a0;
  undefined1 local_680 [16];
  reference local_630;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *local_628;
  __normal_iterator<const_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  local_620;
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  *local_618;
  reference local_5d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_5c8;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_5c0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_5b8;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_5b0 [4];
  size_t local_570;
  char *local_568;
  size_t local_540;
  char *local_538;
  size_t local_510;
  char *local_508;
  undefined1 local_4e0 [32];
  size_t local_4c0;
  char *local_4b8;
  size_t local_480;
  char *local_478;
  double local_470;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_448 [2];
  reference local_428;
  pair<TimeRepresentation<count_time<9,_long>_>,_int> *local_420;
  __normal_iterator<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
  local_418;
  vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
  *local_410;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_408 [4];
  size_t local_3c8;
  char *local_3c0;
  baseType local_3b8;
  double local_3b0;
  int local_394;
  int local_37c;
  int local_364;
  size_t local_320;
  char *local_318;
  size_t local_300;
  char *local_2f8;
  undefined1 local_2e8 [40];
  size_t local_2c0;
  char *local_2b8;
  undefined1 local_2a9;
  BaseType local_2a8;
  BaseType local_2a4;
  reference local_2a0;
  GlobalHandle *local_298;
  __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
  local_290;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *local_288;
  reference local_280;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *local_278;
  __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
  local_270;
  undefined1 *local_268;
  undefined1 local_260 [24];
  ostringstream local_248 [392];
  size_t local_c0;
  char *local_b8;
  allocator<char> local_a9 [17];
  size_t local_98;
  char *local_90;
  uint local_88;
  size_t local_18;
  char *pcStack_10;
  
  local_18 = in_RDX;
  pcStack_10 = in_RCX;
  std::
  function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>
  ::
  function<helics::FederateState::processQueryActual(std::basic_string_view<char,std::char_traits<char>>)const::__0&,void>
            ((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffff328);
  request._M_str = (char *)in_stack_fffffffffffff688;
  request._M_len = in_stack_fffffffffffff680;
  generateInterfaceQueryResults
            (request,(InterfaceInfo *)in_stack_fffffffffffff678,in_stack_fffffffffffff670);
  std::
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  ::~function((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
               *)0x4f2527);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f2534);
  if (bVar1) {
    local_98 = local_18;
    local_90 = pcStack_10;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
               (char *)in_stack_fffffffffffff328);
    __x._M_str = (char *)in_stack_fffffffffffff350;
    __x._M_len = (size_t)in_stack_fffffffffffff348;
    __y._M_str = (char *)in_stack_fffffffffffff340;
    __y._M_len = (size_t)in_stack_fffffffffffff338;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff360,
                 (char *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
                 (allocator<char> *)in_stack_fffffffffffff350);
      std::allocator<char>::~allocator(local_a9);
      local_88 = 1;
    }
    else {
      local_c0 = local_18;
      local_b8 = pcStack_10;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                 (char *)in_stack_fffffffffffff328);
      __x_00._M_str = (char *)in_stack_fffffffffffff350;
      __x_00._M_len = (size_t)in_stack_fffffffffffff348;
      __y_00._M_str = (char *)in_stack_fffffffffffff340;
      __y_00._M_len = (size_t)in_stack_fffffffffffff338;
      bVar1 = std::operator==(__x_00,__y_00);
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_248);
        std::operator<<((ostream *)local_248,"[");
        InterfaceInfo::getInputs_abi_cxx11_((InterfaceInfo *)in_stack_fffffffffffff318);
        local_268 = local_260;
        local_270._M_current =
             (unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
             gmlc::libguarded::
             shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
             ::begin((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                      *)in_stack_fffffffffffff318);
        local_278 = (unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
                    gmlc::libguarded::
                    shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                    ::end((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                           *)in_stack_fffffffffffff318);
        while( true ) {
          bVar1 = __gnu_cxx::
                  operator==<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                            ((__normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                              *)in_stack_fffffffffffff320,
                             (__normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                              *)in_stack_fffffffffffff318);
          __c = (char)((ulong)in_stack_fffffffffffff328 >> 0x38);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          local_280 = __gnu_cxx::
                      __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                      ::operator*(&local_270);
          pIVar3 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
                   operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                               *)0x4f279a);
          local_288 = &pIVar3->input_sources;
          local_290._M_current =
               (GlobalHandle *)
               std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::begin
                         ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                          in_stack_fffffffffffff318);
          local_298 = (GlobalHandle *)
                      std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::end
                                ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                                  *)in_stack_fffffffffffff318);
          while (bVar1 = __gnu_cxx::
                         operator==<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                   ((__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                     *)in_stack_fffffffffffff320,
                                    (__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                     *)in_stack_fffffffffffff318), ((bVar1 ^ 0xffU) & 1) != 0) {
            local_2a0 = __gnu_cxx::
                        __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                        ::operator*(&local_290);
            local_2a4 = (local_2a0->fed_id).gid;
            poVar4 = helics::operator<<((ostream *)in_stack_fffffffffffff318,
                                        (GlobalFederateId)
                                        (BaseType)((ulong)in_stack_fffffffffffff320 >> 0x20));
            std::operator<<(poVar4,':');
            local_2a8 = (local_2a0->handle).hid;
            poVar4 = helics::operator<<((ostream *)in_stack_fffffffffffff318,
                                        (InterfaceHandle)
                                        (BaseType)((ulong)in_stack_fffffffffffff320 >> 0x20));
            std::operator<<(poVar4,';');
            __gnu_cxx::
            __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
            ::operator++(&local_290);
          }
          __gnu_cxx::
          __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
          ::operator++(&local_270);
        }
        gmlc::libguarded::
        shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
        ::unlock((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)in_stack_fffffffffffff320);
        unlock(in_stack_fffffffffffff320);
        local_2a9 = 0;
        std::__cxx11::ostringstream::str();
        pvVar5 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff320);
        if (*pvVar5 == ';') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff320);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),__c);
        local_88 = 1;
        local_2a9 = 1;
        gmlc::libguarded::
        shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
        ::~shared_lock_handle
                  ((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                    *)0x4f29d8);
        std::__cxx11::ostringstream::~ostringstream(local_248);
      }
      else {
        local_2c0 = local_18;
        local_2b8 = pcStack_10;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                   (char *)in_stack_fffffffffffff328);
        __x_01._M_str = (char *)in_stack_fffffffffffff350;
        __x_01._M_len = (size_t)in_stack_fffffffffffff348;
        __y_01._M_str = (char *)in_stack_fffffffffffff340;
        __y_01._M_len = (size_t)in_stack_fffffffffffff338;
        bVar1 = std::operator==(__x_01,__y_01);
        if (bVar1) {
          std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
          operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                      *)0x4f2a79);
          TimeCoordinator::getDependencies
                    ((TimeCoordinator *)
                     CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
          generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::FederateState::processQueryActual[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__1>
                    (in_RDI,local_2e8);
          std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::~vector
                    ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                     CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330));
          local_88 = 1;
        }
        else {
          local_300 = local_18;
          local_2f8 = pcStack_10;
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                     (char *)in_stack_fffffffffffff328);
          __x_02._M_str = (char *)in_stack_fffffffffffff350;
          __x_02._M_len = (size_t)in_stack_fffffffffffff348;
          __y_02._M_str = (char *)in_stack_fffffffffffff340;
          __y_02._M_len = (size_t)in_stack_fffffffffffff338;
          bVar1 = std::operator==(__x_02,__y_02);
          if (bVar1) {
            pTVar6 = std::
                     unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                     ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                   *)0x4f2b55);
            (*(pTVar6->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[0xb])(in_RDI);
            local_88 = 1;
          }
          else {
            local_320 = local_18;
            local_318 = pcStack_10;
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                       (char *)in_stack_fffffffffffff328);
            __x_03._M_str = (char *)in_stack_fffffffffffff350;
            __x_03._M_len = (size_t)in_stack_fffffffffffff348;
            __y_03._M_str = (char *)in_stack_fffffffffffff340;
            __y_03._M_len = (size_t)in_stack_fffffffffffff338;
            bVar1 = std::operator==(__x_03,__y_03);
            if (bVar1) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
              processQueryActual::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)
                         CONCAT17(in_stack_fffffffffffff3f7,in_stack_fffffffffffff3f0),
                         in_stack_fffffffffffff3e8);
              std::atomic<helics::FederateStates>::load(&in_RSI->state,seq_cst);
              fedStateString_abi_cxx11_((FederateStates)((ulong)in_stack_fffffffffffff368 >> 0x38));
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (in_stack_fffffffffffff340,in_stack_fffffffffffff338);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(in_stack_fffffffffffff370,in_stack_fffffffffffff368);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffff328);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffff320);
              local_364 = publicationCount(in_stack_fffffffffffff350);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json<int,_int,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffff320,(int *)in_stack_fffffffffffff318);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(in_stack_fffffffffffff370,in_stack_fffffffffffff368);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffff328);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffff320);
              local_37c = inputCount(in_stack_fffffffffffff350);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json<int,_int,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffff320,(int *)in_stack_fffffffffffff318);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(in_stack_fffffffffffff370,in_stack_fffffffffffff368);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffff328);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffff320);
              local_394 = endpointCount(in_stack_fffffffffffff350);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json<int,_int,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffff320,(int *)in_stack_fffffffffffff318);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(in_stack_fffffffffffff370,in_stack_fffffffffffff368);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffff328);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffff320);
              local_3b8 = (baseType)grantedTime(in_RSI);
              local_3b0 = TimeRepresentation::operator_cast_to_double
                                    ((TimeRepresentation<count_time<9,_long>_> *)0x4f2e4b);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json<double,_double,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffff320,(double *)in_stack_fffffffffffff318);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(in_stack_fffffffffffff370,in_stack_fffffffffffff368);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffff328);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffff320);
              fileops::generateJsonString
                        ((json *)in_stack_fffffffffffff328,
                         SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
              local_88 = 1;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffff320);
            }
            else {
              local_3c8 = local_18;
              local_3c0 = pcStack_10;
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                         (char *)in_stack_fffffffffffff328);
              __x_04._M_str = (char *)in_stack_fffffffffffff350;
              __x_04._M_len = (size_t)in_stack_fffffffffffff348;
              __y_04._M_str = (char *)in_stack_fffffffffffff340;
              __y_04._M_len = (size_t)in_stack_fffffffffffff338;
              bVar1 = std::operator==(__x_04,__y_04);
              if (bVar1) {
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
                processQueryActual::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)
                           CONCAT17(in_stack_fffffffffffff3f7,in_stack_fffffffffffff3f0),
                           in_stack_fffffffffffff3e8);
                CLI::std::
                initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                ::initializer_list(local_408);
                init._M_array._4_4_ = in_stack_fffffffffffff334;
                init._M_array._0_4_ = in_stack_fffffffffffff330;
                init._M_len = (size_type)in_stack_fffffffffffff338;
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::array(init);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffff328);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffff320);
                pTVar6 = std::
                         unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                         ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                       *)0x4f30dc);
                local_410 = TimeCoordinator::getBarriers(pTVar6);
                local_418._M_current =
                     (pair<TimeRepresentation<count_time<9,_long>_>,_int> *)
                     std::
                     vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
                     ::begin((vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
                              *)in_stack_fffffffffffff318);
                local_420 = (pair<TimeRepresentation<count_time<9,_long>_>,_int> *)
                            std::
                            vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
                            ::end((vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
                                   *)in_stack_fffffffffffff318);
                while (bVar1 = __gnu_cxx::
                               operator==<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
                                         ((__normal_iterator<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
                                           *)in_stack_fffffffffffff320,
                                          (__normal_iterator<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
                                           *)in_stack_fffffffffffff318), ((bVar1 ^ 0xffU) & 1) != 0)
                {
                  local_428 = __gnu_cxx::
                              __normal_iterator<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
                              ::operator*(&local_418);
                  CLI::std::
                  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  ::initializer_list(local_448);
                  init_00._M_array._4_4_ = in_stack_fffffffffffff334;
                  init_00._M_array._0_4_ = in_stack_fffffffffffff330;
                  init_00._M_len = (size_type)in_stack_fffffffffffff338;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::object(init_00);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::basic_json<const_int_&,_int,_0>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)in_stack_fffffffffffff320,(int *)in_stack_fffffffffffff318);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>(in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffff328);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)in_stack_fffffffffffff320);
                  local_470 = TimeRepresentation::operator_cast_to_double
                                        ((TimeRepresentation<count_time<9,_long>_> *)0x4f31f7);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::basic_json<double,_double,_0>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)in_stack_fffffffffffff320,(double *)in_stack_fffffffffffff318);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>(in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffff328);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)in_stack_fffffffffffff320);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>(in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::push_back(in_stack_fffffffffffff380,
                              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffff378);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)in_stack_fffffffffffff320);
                  __gnu_cxx::
                  __normal_iterator<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
                  ::operator++(&local_418);
                }
                fileops::generateJsonString
                          ((json *)in_stack_fffffffffffff328,
                           SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
                local_88 = 1;
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffff320);
              }
              else {
                local_480 = local_18;
                local_478 = pcStack_10;
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                           (char *)in_stack_fffffffffffff328);
                __x_05._M_str = (char *)in_stack_fffffffffffff350;
                __x_05._M_len = (size_t)in_stack_fffffffffffff348;
                __y_05._M_str = (char *)in_stack_fffffffffffff340;
                __y_05._M_len = (size_t)in_stack_fffffffffffff338;
                bVar1 = std::operator==(__x_05,__y_05);
                if (bVar1) {
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
                  processQueryActual::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)
                             CONCAT17(in_stack_fffffffffffff3f7,in_stack_fffffffffffff3f0),
                             in_stack_fffffffffffff3e8);
                  std::atomic<helics::FederateStates>::load(&in_RSI->state,seq_cst);
                  fedStateString_abi_cxx11_
                            ((FederateStates)((ulong)in_stack_fffffffffffff368 >> 0x38));
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::
                  basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (in_stack_fffffffffffff340,in_stack_fffffffffffff338);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>(in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffff328);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)in_stack_fffffffffffff320);
                  fileops::generateJsonString
                            ((json *)in_stack_fffffffffffff328,
                             SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
                  local_88 = 1;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)in_stack_fffffffffffff320);
                }
                else {
                  local_4c0 = local_18;
                  local_4b8 = pcStack_10;
                  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                             (char *)in_stack_fffffffffffff328);
                  __x_06._M_str = (char *)in_stack_fffffffffffff350;
                  __x_06._M_len = (size_t)in_stack_fffffffffffff348;
                  __y_06._M_str = (char *)in_stack_fffffffffffff340;
                  __y_06._M_len = (size_t)in_stack_fffffffffffff338;
                  bVar1 = std::operator==(__x_06,__y_06);
                  if (bVar1) {
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
                    processQueryActual::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)
                               CONCAT17(in_stack_fffffffffffff3f7,in_stack_fffffffffffff3f0),
                               in_stack_fffffffffffff3e8);
                    std::atomic<helics::FederateStates>::load(&in_RSI->state,seq_cst);
                    fedStateString_abi_cxx11_
                              ((FederateStates)((ulong)in_stack_fffffffffffff368 >> 0x38));
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (in_stack_fffffffffffff340,in_stack_fffffffffffff338);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)in_stack_fffffffffffff328);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)in_stack_fffffffffffff320);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::basic_json<const_bool_&,_bool,_0>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)in_stack_fffffffffffff320,(bool *)in_stack_fffffffffffff318);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)in_stack_fffffffffffff328);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)in_stack_fffffffffffff320);
                    std::
                    unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                    ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                  *)0x4f36cd);
                    bVar1 = BaseTimeCoordinator::empty((BaseTimeCoordinator *)0x4f36d5);
                    if (!bVar1) {
                      pTVar6 = std::
                               unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                               ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                             *)0x4f3700);
                      (*(pTVar6->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[0xc])
                                (pTVar6,local_4e0);
                    }
                    fileops::generateJsonString
                              ((json *)in_stack_fffffffffffff328,
                               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
                    local_88 = 1;
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)in_stack_fffffffffffff320);
                  }
                  else {
                    local_510 = local_18;
                    local_508 = pcStack_10;
                    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                               (char *)in_stack_fffffffffffff328);
                    __x_07._M_str = (char *)in_stack_fffffffffffff350;
                    __x_07._M_len = (size_t)in_stack_fffffffffffff348;
                    __y_07._M_str = (char *)in_stack_fffffffffffff340;
                    __y_07._M_len = (size_t)in_stack_fffffffffffff338;
                    bVar1 = std::operator==(__x_07,__y_07);
                    if (bVar1) {
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
                      std::
                      unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                      ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                    *)0x4f384b);
                      TimeCoordinator::generateConfig
                                (in_stack_fffffffffffff480,in_stack_fffffffffffff478);
                      generateConfig(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
                      fileops::generateJsonString
                                ((json *)in_stack_fffffffffffff328,
                                 SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
                      local_88 = 1;
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)in_stack_fffffffffffff320);
                    }
                    else {
                      local_540 = local_18;
                      local_538 = pcStack_10;
                      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                                 (char *)in_stack_fffffffffffff328);
                      __x_08._M_str = (char *)in_stack_fffffffffffff350;
                      __x_08._M_len = (size_t)in_stack_fffffffffffff348;
                      __y_08._M_str = (char *)in_stack_fffffffffffff340;
                      __y_08._M_len = (size_t)in_stack_fffffffffffff338;
                      bVar1 = std::operator==(__x_08,__y_08);
                      if (bVar1) {
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
                        std::
                        unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                        ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                      *)0x4f395f);
                        TimeCoordinator::generateConfig
                                  (in_stack_fffffffffffff480,in_stack_fffffffffffff478);
                        generateConfig(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
                        InterfaceInfo::generateInferfaceConfig
                                  (in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
                        addFederateTags(in_stack_fffffffffffff3e0,
                                        (FederateState *)
                                        CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8
                                                ));
                        fileops::generateJsonString
                                  ((json *)in_stack_fffffffffffff328,
                                   SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
                        local_88 = 1;
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff320);
                      }
                      else {
                        local_570 = local_18;
                        local_568 = pcStack_10;
                        CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                        basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)
                                          CONCAT44(in_stack_fffffffffffff334,
                                                   in_stack_fffffffffffff330),
                                          (char *)in_stack_fffffffffffff328);
                        __x_09._M_str = (char *)in_stack_fffffffffffff350;
                        __x_09._M_len = (size_t)in_stack_fffffffffffff348;
                        __y_09._M_str = (char *)in_stack_fffffffffffff340;
                        __y_09._M_len = (size_t)in_stack_fffffffffffff338;
                        bVar1 = std::operator==(__x_09,__y_09);
                        if (bVar1) {
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                        *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
                          processQueryActual::anon_class_8_1_8991fb9c::operator()
                                    ((anon_class_8_1_8991fb9c *)
                                     CONCAT17(in_stack_fffffffffffff3f7,in_stack_fffffffffffff3f0),
                                     in_stack_fffffffffffff3e8);
                          InterfaceInfo::getUnconnectedInterfaces
                                    ((InterfaceInfo *)in_stack_fffffffffffff650,
                                     (json *)in_stack_fffffffffffff648);
                          bVar1 = CLI::std::
                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::empty((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)CONCAT44(in_stack_fffffffffffff334,
                                                      in_stack_fffffffffffff330));
                          if (!bVar1) {
                            CLI::std::
                            initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                            ::initializer_list(local_5b0);
                            init_01._M_array._4_4_ = in_stack_fffffffffffff334;
                            init_01._M_array._0_4_ = in_stack_fffffffffffff330;
                            init_01._M_len = (size_type)in_stack_fffffffffffff338;
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::object(init_01);
                            local_5b8 = &in_RSI->tags;
                            local_5c0._M_current =
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)CLI::std::
                                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)in_stack_fffffffffffff318);
                            local_5c8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)CLI::std::
                                           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_fffffffffffff318);
                            while (bVar1 = __gnu_cxx::
                                           operator==<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                     ((
                                                  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  *)in_stack_fffffffffffff320,
                                                  (
                                                  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  *)in_stack_fffffffffffff318),
                                  ((bVar1 ^ 0xffU) & 1) != 0) {
                              local_5d0 = __gnu_cxx::
                                          __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ::operator*(&local_5c0);
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::
                              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                        (in_stack_fffffffffffff340,in_stack_fffffffffffff338);
                              std::__cxx11::string::string
                                        (in_stack_fffffffffffff360,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_fffffffffffff35c,
                                                     in_stack_fffffffffffff358));
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                            *)in_stack_fffffffffffff390,in_stack_fffffffffffff388);
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                           *)CONCAT44(in_stack_fffffffffffff334,
                                                      in_stack_fffffffffffff330),
                                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                           *)in_stack_fffffffffffff328);
                              std::__cxx11::string::~string(&in_stack_fffffffffffff320->name);
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                             *)in_stack_fffffffffffff320);
                              __gnu_cxx::
                              __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ::operator++(&local_5c0);
                            }
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::basic_json(in_stack_fffffffffffff380,
                                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          *)in_stack_fffffffffffff378);
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>
                                      (in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)CONCAT44(in_stack_fffffffffffff334,
                                                    in_stack_fffffffffffff330),
                                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff328);
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                           *)in_stack_fffffffffffff320);
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                           *)in_stack_fffffffffffff320);
                          }
                          bVar1 = std::
                                  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                  ::empty((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                           *)CONCAT44(in_stack_fffffffffffff334,
                                                      in_stack_fffffffffffff330));
                          if (!bVar1) {
                            local_618 = &in_RSI->queryCallbacks;
                            local_620._M_current =
                                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                                  *)std::
                                    vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                    ::begin((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                             *)in_stack_fffffffffffff318);
                            local_628 = (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                                         *)std::
                                           vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                           ::end((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                                  *)in_stack_fffffffffffff318);
                            while (bVar1 = __gnu_cxx::
                                           operator==<const_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                                     ((
                                                  __normal_iterator<const_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                                  *)in_stack_fffffffffffff320,
                                                  (
                                                  __normal_iterator<const_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                                  *)in_stack_fffffffffffff318),
                                  ((bVar1 ^ 0xffU) & 1) != 0) {
                              local_630 = __gnu_cxx::
                                          __normal_iterator<const_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                          ::operator*(&local_620);
                              bVar1 = std::function::operator_cast_to_bool
                                                ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                                                  *)0x4f3dc7);
                              if (bVar1) {
                                CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                basic_string_view((basic_string_view<char,_std::char_traits<char>_>
                                                   *)CONCAT44(in_stack_fffffffffffff334,
                                                              in_stack_fffffffffffff330),
                                                  (char *)in_stack_fffffffffffff328);
                                __args._M_len._4_4_ = in_stack_fffffffffffff334;
                                __args._M_len._0_4_ = in_stack_fffffffffffff330;
                                __args._M_str = (char *)in_stack_fffffffffffff338;
                                std::
                                function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                                ::operator()(in_stack_fffffffffffff328,__args);
                                bVar1 = CLI::std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x4f3e28);
                                if (bVar1) {
LAB_004f3fc7:
                                  local_88 = 0;
                                }
                                else {
                                  local_680 = (undefined1  [16])
                                              std::__cxx11::string::
                                              operator_cast_to_basic_string_view
                                                        ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff320);
                                  jsonString._M_str = in_stack_fffffffffffff398;
                                  jsonString._M_len = (size_t)in_stack_fffffffffffff390;
                                  fileops::loadJsonStr_abi_cxx11_(jsonString);
                                  bVar1 = nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::contains<const_char_(&)[6],_0>
                                                    (in_stack_fffffffffffff340,
                                                     (char (*) [6])in_stack_fffffffffffff338);
                                  if (bVar1) {
                                    local_88 = 0;
                                  }
                                  else {
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    ::basic_json(in_stack_fffffffffffff380,
                                                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff378);
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                    ::operator[]<char_const>
                                              (in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                 *)CONCAT44(in_stack_fffffffffffff334,
                                                            in_stack_fffffffffffff330),
                                                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                 *)in_stack_fffffffffffff328);
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    ::~basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff320);
                                    local_88 = 10;
                                  }
                                  nlohmann::json_abi_v3_11_3::
                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                 *)in_stack_fffffffffffff320);
                                  if (local_88 == 0) goto LAB_004f3fc7;
                                }
                                std::__cxx11::string::~string(&in_stack_fffffffffffff320->name);
                                if (local_88 != 0) break;
                              }
                              __gnu_cxx::
                              __normal_iterator<const_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                              ::operator++(&local_620);
                            }
                          }
                          fileops::generateJsonString
                                    ((json *)in_stack_fffffffffffff328,
                                     SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
                          local_88 = 1;
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff320);
                        }
                        else {
                          local_6a8 = local_18;
                          local_6a0 = pcStack_10;
                          CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                          basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)
                                            CONCAT44(in_stack_fffffffffffff334,
                                                     in_stack_fffffffffffff330),
                                            (char *)in_stack_fffffffffffff328);
                          __x_10._M_str = (char *)in_stack_fffffffffffff350;
                          __x_10._M_len = (size_t)in_stack_fffffffffffff348;
                          __y_10._M_str = (char *)in_stack_fffffffffffff340;
                          __y_10._M_len = (size_t)in_stack_fffffffffffff338;
                          bVar1 = std::operator==(__x_10,__y_10);
                          if (bVar1) {
                            CLI::std::
                            initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                            ::initializer_list(local_6d8);
                            init_02._M_array._4_4_ = in_stack_fffffffffffff334;
                            init_02._M_array._0_4_ = in_stack_fffffffffffff330;
                            init_02._M_len = (size_type)in_stack_fffffffffffff338;
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::object(init_02);
                            local_6e0 = &in_RSI->tags;
                            local_6e8._M_current =
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)CLI::std::
                                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)in_stack_fffffffffffff318);
                            local_6f0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)CLI::std::
                                           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_fffffffffffff318);
                            while (bVar1 = __gnu_cxx::
                                           operator==<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                     ((
                                                  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  *)in_stack_fffffffffffff320,
                                                  (
                                                  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  *)in_stack_fffffffffffff318),
                                  ((bVar1 ^ 0xffU) & 1) != 0) {
                              local_6f8 = __gnu_cxx::
                                          __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ::operator*(&local_6e8);
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::
                              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                        (in_stack_fffffffffffff340,in_stack_fffffffffffff338);
                              std::__cxx11::string::string
                                        (in_stack_fffffffffffff360,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_fffffffffffff35c,
                                                     in_stack_fffffffffffff358));
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                            *)in_stack_fffffffffffff390,in_stack_fffffffffffff388);
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                           *)CONCAT44(in_stack_fffffffffffff334,
                                                      in_stack_fffffffffffff330),
                                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                           *)in_stack_fffffffffffff328);
                              std::__cxx11::string::~string(&in_stack_fffffffffffff320->name);
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                             *)in_stack_fffffffffffff320);
                              __gnu_cxx::
                              __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ::operator++(&local_6e8);
                            }
                            fileops::generateJsonString
                                      ((json *)in_stack_fffffffffffff328,
                                       SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
                            local_88 = 1;
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                           *)in_stack_fffffffffffff320);
                          }
                          else {
                            iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                    compare((basic_string_view<char,_std::char_traits<char>_> *)
                                            in_stack_fffffffffffff350,
                                            (size_type)in_stack_fffffffffffff348,
                                            (size_type)in_stack_fffffffffffff340,
                                            (char *)in_stack_fffffffffffff338);
                            if (iVar2 == 0) {
                              local_738[0]._M_len = local_18;
                              local_738[0]._M_str = pcStack_10;
                              std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                                        (local_738,4);
                              local_748[1]._M_current =
                                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&in_RSI->tags;
                              local_748[0]._M_current =
                                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)CLI::std::
                                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)in_stack_fffffffffffff318);
                              local_750 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)CLI::std::
                                             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ::end((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_fffffffffffff318);
                              while (bVar1 = __gnu_cxx::
                                             operator==<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                       ((
                                                  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  *)in_stack_fffffffffffff320,
                                                  (
                                                  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  *)in_stack_fffffffffffff318),
                                    ((bVar1 ^ 0xffU) & 1) != 0) {
                                local_758 = __gnu_cxx::
                                            __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            ::operator*(local_748);
                                local_768 = local_738[0]._M_len;
                                local_760 = local_738[0]._M_str;
                                local_778 = std::__cxx11::string::operator_cast_to_basic_string_view
                                                      ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff320);
                                __x_11._M_str = (char *)in_stack_fffffffffffff350;
                                __x_11._M_len = (size_t)in_stack_fffffffffffff348;
                                __y_11._M_str = (char *)in_stack_fffffffffffff340;
                                __y_11._M_len = (size_t)in_stack_fffffffffffff338;
                                bVar1 = std::operator==(__x_11,__y_11);
                                if (bVar1) {
                                  generateJsonQuotedString(in_stack_fffffffffffff348);
                                  local_88 = 1;
                                  goto LAB_004f5294;
                                }
                                __gnu_cxx::
                                __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ::operator++(local_748);
                              }
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        (in_stack_fffffffffffff360,
                                         (char *)CONCAT44(in_stack_fffffffffffff35c,
                                                          in_stack_fffffffffffff358),
                                         (allocator<char> *)in_stack_fffffffffffff350);
                              std::allocator<char>::~allocator(&local_779);
                              local_88 = 1;
                            }
                            else {
                              local_790 = local_18;
                              local_788 = pcStack_10;
                              CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                              basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)
                                                CONCAT44(in_stack_fffffffffffff334,
                                                         in_stack_fffffffffffff330),
                                                (char *)in_stack_fffffffffffff328);
                              __x_12._M_str = (char *)in_stack_fffffffffffff350;
                              __x_12._M_len = (size_t)in_stack_fffffffffffff348;
                              __y_12._M_str = (char *)in_stack_fffffffffffff340;
                              __y_12._M_len = (size_t)in_stack_fffffffffffff338;
                              bVar1 = std::operator==(__x_12,__y_12);
                              if (bVar1) {
                                std::
                                unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                              *)0x4f4504);
                                TimeCoordinator::getDependents
                                          ((TimeCoordinator *)
                                           CONCAT44(in_stack_fffffffffffff35c,
                                                    in_stack_fffffffffffff358));
                                generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::FederateState::processQueryActual[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__2>
                                          (in_RDI,local_7b8);
                                std::
                                vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                ::~vector((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                           *)CONCAT44(in_stack_fffffffffffff334,
                                                      in_stack_fffffffffffff330));
                                local_88 = 1;
                              }
                              else {
                                CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                basic_string_view((basic_string_view<char,_std::char_traits<char>_>
                                                   *)CONCAT44(in_stack_fffffffffffff334,
                                                              in_stack_fffffffffffff330),
                                                  (char *)in_stack_fffffffffffff328);
                                __x_13._M_str = (char *)in_stack_fffffffffffff350;
                                __x_13._M_len = (size_t)in_stack_fffffffffffff348;
                                __y_13._M_str = (char *)in_stack_fffffffffffff340;
                                __y_13._M_len = (size_t)in_stack_fffffffffffff338;
                                bVar1 = std::operator==(__x_13,__y_13);
                                if (bVar1) {
                                  nlohmann::json_abi_v3_11_3::
                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                *)in_stack_fffffffffffff320,
                                               in_stack_fffffffffffff318);
                                  processQueryActual::anon_class_8_1_8991fb9c::operator()
                                            ((anon_class_8_1_8991fb9c *)
                                             CONCAT17(in_stack_fffffffffffff3f7,
                                                      in_stack_fffffffffffff3f0),
                                             in_stack_fffffffffffff3e8);
                                  this_00 = std::
                                            unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>
                                            ::operator->((
                                                  unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>
                                                  *)0x4f4616);
                                  LogManager::getLogBuffer(this_00);
                                  bufferToJson(in_stack_fffffffffffff390,
                                               (json *)in_stack_fffffffffffff388);
                                  fileops::generateJsonString
                                            ((json *)in_stack_fffffffffffff328,
                                             SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
                                  local_88 = 1;
                                  nlohmann::json_abi_v3_11_3::
                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                 *)in_stack_fffffffffffff320);
                                }
                                else {
                                  CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )CONCAT44(in_stack_fffffffffffff334,
                                                            in_stack_fffffffffffff330),
                                                  (char *)in_stack_fffffffffffff328);
                                  __x_14._M_str = (char *)in_stack_fffffffffffff350;
                                  __x_14._M_len = (size_t)in_stack_fffffffffffff348;
                                  __y_14._M_str = (char *)in_stack_fffffffffffff340;
                                  __y_14._M_len = (size_t)in_stack_fffffffffffff338;
                                  bVar1 = std::operator==(__x_14,__y_14);
                                  if (bVar1) {
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff320,
                                                 in_stack_fffffffffffff318);
                                    processQueryActual::anon_class_8_1_8991fb9c::operator()
                                              ((anon_class_8_1_8991fb9c *)
                                               CONCAT17(in_stack_fffffffffffff3f7,
                                                        in_stack_fffffffffffff3f0),
                                               in_stack_fffffffffffff3e8);
                                    InterfaceInfo::generateDataFlowGraph
                                              (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
                                    fileops::generateJsonString
                                              ((json *)in_stack_fffffffffffff328,
                                               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
                                    local_88 = 1;
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    ::~basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff320);
                                  }
                                  else {
                                    CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )CONCAT44(in_stack_fffffffffffff334,
                                                            in_stack_fffffffffffff330),
                                                  (char *)in_stack_fffffffffffff328);
                                    __x_15._M_str = (char *)in_stack_fffffffffffff350;
                                    __x_15._M_len = (size_t)in_stack_fffffffffffff348;
                                    __y_15._M_str = (char *)in_stack_fffffffffffff340;
                                    __y_15._M_len = (size_t)in_stack_fffffffffffff338;
                                    bVar1 = std::operator==(__x_15,__y_15);
                                    if (!bVar1) {
                                      CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )CONCAT44(in_stack_fffffffffffff334,
                                                            in_stack_fffffffffffff330),
                                                  (char *)in_stack_fffffffffffff328);
                                      __x_16._M_str = (char *)in_stack_fffffffffffff350;
                                      __x_16._M_len = (size_t)in_stack_fffffffffffff348;
                                      __y_16._M_str = (char *)in_stack_fffffffffffff340;
                                      __y_16._M_len = (size_t)in_stack_fffffffffffff338;
                                      bVar1 = std::operator==(__x_16,__y_16);
                                      if (!bVar1) {
                                        local_8e0[2].m_data._0_8_ = local_18;
                                        local_8e0[2].m_data.m_value = (json_value)pcStack_10;
                                        CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                        basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )CONCAT44(in_stack_fffffffffffff334,
                                                            in_stack_fffffffffffff330),
                                                  (char *)in_stack_fffffffffffff328);
                                        __x_17._M_str = (char *)in_stack_fffffffffffff350;
                                        __x_17._M_len = (size_t)in_stack_fffffffffffff348;
                                        __y_17._M_str = (char *)in_stack_fffffffffffff340;
                                        __y_17._M_len = (size_t)in_stack_fffffffffffff338;
                                        bVar1 = std::operator==(__x_17,__y_17);
                                        if (bVar1) {
                                          val = local_8e0;
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff320,
                                                  in_stack_fffffffffffff318);
                                          processQueryActual::anon_class_8_1_8991fb9c::operator()
                                                    ((anon_class_8_1_8991fb9c *)
                                                     CONCAT17(in_stack_fffffffffffff3f7,
                                                              in_stack_fffffffffffff3f0),
                                                     in_stack_fffffffffffff3e8);
                                          CLI::std::
                                          initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                                          ::initializer_list(&local_900);
                                          init_03._M_array._4_4_ = in_stack_fffffffffffff334;
                                          init_03._M_array._0_4_ = in_stack_fffffffffffff330;
                                          init_03._M_len = (size_type)in_stack_fffffffffffff338;
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::array(init_03);
                                          this_01 = nlohmann::json_abi_v3_11_3::
                                                                                                        
                                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                                  ::operator[]<char_const>
                                                            (in_stack_fffffffffffff370,
                                                             in_stack_fffffffffffff368);
                                          key = local_8f0;
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::operator=((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)CONCAT44(in_stack_fffffffffffff334,
                                                             in_stack_fffffffffffff330),
                                                  (
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff328);
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::~basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff320);
                                          std::
                                          unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                          ::operator->((
                                                  unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                                  *)0x4f4b7d);
                                          TimeCoordinator::getDependents
                                                    ((TimeCoordinator *)
                                                     CONCAT44(in_stack_fffffffffffff35c,
                                                              in_stack_fffffffffffff358));
                                          local_908 = local_920;
                                          local_928._M_current =
                                               (GlobalFederateId *)
                                               std::
                                               vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                               ::begin((
                                                  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                  *)in_stack_fffffffffffff318);
                                          local_930 = (GlobalFederateId *)
                                                      std::
                                                  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                  ::end((
                                                  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                  *)in_stack_fffffffffffff318);
                                          while (bVar1 = __gnu_cxx::
                                                                                                                  
                                                  operator==<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                            ((
                                                  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                  *)in_stack_fffffffffffff320,
                                                  (
                                                  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                  *)in_stack_fffffffffffff318),
                                                ((bVar1 ^ 0xffU) & 1) != 0) {
                                            local_938 = __gnu_cxx::
                                                                                                                
                                                  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                  ::operator*(&local_928);
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                            ::operator[]<char_const>(this_01,key);
                                            in_stack_fffffffffffff35c =
                                                 GlobalFederateId::baseValue(local_938);
                                            local_94c = in_stack_fffffffffffff35c;
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                            ::basic_json<int,_int,_0>
                                                      ((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff320,
                                                  (int *)in_stack_fffffffffffff318);
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                            ::push_back(in_stack_fffffffffffff380,val);
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                            ::~basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff320);
                                            __gnu_cxx::
                                            __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                            ::operator++(&local_928);
                                          }
                                          local_88 = 0x10;
                                          std::
                                          vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                          ::~vector((
                                                  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                  *)CONCAT44(in_stack_fffffffffffff334,
                                                             in_stack_fffffffffffff330));
                                          CLI::std::
                                          initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                                          ::initializer_list(local_970);
                                          init_04._M_array._4_4_ = in_stack_fffffffffffff334;
                                          init_04._M_array._0_4_ = in_stack_fffffffffffff330;
                                          init_04._M_len = (size_type)in_stack_fffffffffffff338;
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::array(init_04);
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                          ::operator[]<char_const>(this_01,key);
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::operator=((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)CONCAT44(in_stack_fffffffffffff334,
                                                             in_stack_fffffffffffff330),
                                                  (
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff328);
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::~basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff320);
                                          std::
                                          unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                          ::operator->((
                                                  unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                                  *)0x4f4d9a);
                                          TimeCoordinator::getDependencies
                                                    ((TimeCoordinator *)
                                                     CONCAT44(in_stack_fffffffffffff35c,
                                                              in_stack_fffffffffffff358));
                                          local_998._M_current =
                                               (GlobalFederateId *)
                                               std::
                                               vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                               ::begin((
                                                  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                  *)in_stack_fffffffffffff318);
                                          std::
                                          vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                          ::end((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                 *)in_stack_fffffffffffff318);
                                          while (bVar1 = __gnu_cxx::
                                                                                                                  
                                                  operator==<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                            ((
                                                  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                  *)in_stack_fffffffffffff320,
                                                  (
                                                  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                  *)in_stack_fffffffffffff318),
                                                ((bVar1 ^ 0xffU) & 1) != 0) {
                                            this_02 = __gnu_cxx::
                                                                                                            
                                                  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                  ::operator*(&local_998);
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                            ::operator[]<char_const>(this_01,key);
                                            in_stack_fffffffffffff334 =
                                                 GlobalFederateId::baseValue(this_02);
                                            in_stack_fffffffffffff328 =
                                                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                                                  *)&stack0xfffffffffffff648;
                                            local_9bc = in_stack_fffffffffffff334;
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                            ::basic_json<int,_int,_0>
                                                      ((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff320,
                                                  (int *)in_stack_fffffffffffff318);
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                            ::push_back(in_stack_fffffffffffff380,val);
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                            ::~basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff320);
                                            __gnu_cxx::
                                            __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                            ::operator++(&local_998);
                                          }
                                          local_88 = 0x12;
                                          std::
                                          vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                          ::~vector((
                                                  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                  *)CONCAT44(in_stack_fffffffffffff334,
                                                             in_stack_fffffffffffff330));
                                          fileops::generateJsonString
                                                    ((json *)in_stack_fffffffffffff328,
                                                     SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,
                                                           0));
                                          local_88 = 1;
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::~basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff320);
                                        }
                                        else {
                                          bVar1 = std::
                                                  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                                  ::empty((
                                                  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                                  *)CONCAT44(in_stack_fffffffffffff334,
                                                             in_stack_fffffffffffff330));
                                          if (!bVar1) {
                                            local_9c8 = &in_RSI->queryCallbacks;
                                            local_9d0._M_current =
                                                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                                                  *)std::
                                                  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                                  ::begin((
                                                  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                                  *)in_stack_fffffffffffff318);
                                            local_9d8 = (
                                                  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                                                  *)std::
                                                  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                                  ::end((
                                                  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                                  *)in_stack_fffffffffffff318);
                                            while (bVar1 = __gnu_cxx::
                                                                                                                      
                                                  operator==<const_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                                            ((
                                                  __normal_iterator<const_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                                  *)in_stack_fffffffffffff320,
                                                  (
                                                  __normal_iterator<const_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                                  *)in_stack_fffffffffffff318),
                                                  ((bVar1 ^ 0xffU) & 1) != 0) {
                                              local_9e0 = __gnu_cxx::
                                                                                                                    
                                                  __normal_iterator<const_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                                  ::operator*(&local_9d0);
                                              bVar1 = std::function::operator_cast_to_bool
                                                                ((
                                                  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                                                  *)0x4f500b);
                                              if (bVar1) {
                                                local_9e1 = 0;
                                                local_9f8 = local_18;
                                                pcStack_9f0 = pcStack_10;
                                                __args_00._M_len._4_4_ = in_stack_fffffffffffff334;
                                                __args_00._M_len._0_4_ = in_stack_fffffffffffff330;
                                                __args_00._M_str = (char *)in_stack_fffffffffffff338
                                                ;
                                                std::
                                                function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                                                ::operator()(in_stack_fffffffffffff328,__args_00);
                                                bVar1 = CLI::std::__cxx11::
                                                                                                                
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  ::empty((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x4f5060);
                                                if (!bVar1) {
                                                  local_9e1 = 1;
                                                }
                                                local_88 = (uint)!bVar1;
                                                if ((local_9e1 & 1) == 0) {
                                                  std::__cxx11::string::~string
                                                            (&in_stack_fffffffffffff320->name);
                                                }
                                                if (local_88 != 0) goto LAB_004f5294;
                                              }
                                              __gnu_cxx::
                                              __normal_iterator<const_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                              ::operator++(&local_9d0);
                                            }
                                          }
                                          local_a00 = &in_RSI->tags;
                                          local_a08._M_current =
                                               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)CLI::std::
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::begin((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_fffffffffffff318);
                                          CLI::std::
                                          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 *)in_stack_fffffffffffff318);
                                          while( true ) {
                                            bVar1 = __gnu_cxx::
                                                                                                        
                                                  operator==<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                            ((
                                                  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  *)in_stack_fffffffffffff320,
                                                  (
                                                  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  *)in_stack_fffffffffffff318);
                                            code = (JsonErrorCodes)
                                                   ((ulong)in_stack_fffffffffffff380 >> 0x20);
                                            if (((bVar1 ^ 0xffU) & 1) == 0) break;
                                            __gnu_cxx::
                                            __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            ::operator*(&local_a08);
                                            local_a38 = std::__cxx11::string::
                                                        operator_cast_to_basic_string_view
                                                                  ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff320);
                                            __x_18._M_str = (char *)in_stack_fffffffffffff350;
                                            __x_18._M_len = (size_t)in_stack_fffffffffffff348;
                                            __y_18._M_str = (char *)in_stack_fffffffffffff340;
                                            __y_18._M_len = (size_t)in_stack_fffffffffffff338;
                                            bVar1 = std::operator==(__x_18,__y_18);
                                            if (bVar1) {
                                              generateJsonQuotedString(in_stack_fffffffffffff348);
                                              local_88 = 1;
                                              goto LAB_004f5294;
                                            }
                                            __gnu_cxx::
                                            __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            ::operator++(&local_a08);
                                          }
                                          in_stack_fffffffffffff320 = (FederateState *)local_a59;
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    (in_stack_fffffffffffff360,
                                                     (char *)CONCAT44(in_stack_fffffffffffff35c,
                                                                      in_stack_fffffffffffff358),
                                                     (allocator<char> *)in_stack_fffffffffffff350);
                                          generateJsonErrorResponse(code,in_stack_fffffffffffff378);
                                          std::__cxx11::string::~string
                                                    (&in_stack_fffffffffffff320->name);
                                          std::allocator<char>::~allocator(local_a59);
                                          local_88 = 1;
                                        }
                                        goto LAB_004f5294;
                                      }
                                    }
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff320,
                                                 in_stack_fffffffffffff318);
                                    processQueryActual::anon_class_8_1_8991fb9c::operator()
                                              ((anon_class_8_1_8991fb9c *)
                                               CONCAT17(in_stack_fffffffffffff3f7,
                                                        in_stack_fffffffffffff3f0),
                                               in_stack_fffffffffffff3e8);
                                    pTVar6 = std::
                                             unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                             ::operator->((
                                                  unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                                  *)0x4f48aa);
                                    local_890 = (baseType)TimeCoordinator::getGrantedTime(pTVar6);
                                    local_888 = TimeRepresentation::operator_cast_to_double
                                                          ((TimeRepresentation<count_time<9,_long>_>
                                                            *)0x4f48d9);
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    ::basic_json<double,_double,_0>
                                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                *)in_stack_fffffffffffff320,
                                               (double *)in_stack_fffffffffffff318);
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                    ::operator[]<char_const>
                                              (in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                 *)CONCAT44(in_stack_fffffffffffff334,
                                                            in_stack_fffffffffffff330),
                                                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                 *)in_stack_fffffffffffff328);
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    ::~basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff320);
                                    std::
                                    unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                    ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                                  *)0x4f494a);
                                    local_8e0[3].m_data._0_8_ =
                                         TimeCoordinator::allowedSendTime(in_stack_fffffffffffff318)
                                    ;
                                    local_8e0[3].m_data.m_value.number_float =
                                         TimeRepresentation::operator_cast_to_double
                                                   ((TimeRepresentation<count_time<9,_long>_> *)
                                                    0x4f4979);
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    ::basic_json<double,_double,_0>
                                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                *)in_stack_fffffffffffff320,
                                               (double *)in_stack_fffffffffffff318);
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                    ::operator[]<char_const>
                                              (in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                 *)CONCAT44(in_stack_fffffffffffff334,
                                                            in_stack_fffffffffffff330),
                                                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                 *)in_stack_fffffffffffff328);
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    ::~basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff320);
                                    fileops::generateJsonString
                                              ((json *)in_stack_fffffffffffff328,
                                               SUB81((ulong)in_stack_fffffffffffff320 >> 0x38,0));
                                    local_88 = 1;
                                    nlohmann::json_abi_v3_11_3::
                                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    ::~basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff320);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    std::__cxx11::string::string
              (in_stack_fffffffffffff360,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
    local_88 = 1;
  }
LAB_004f5294:
  std::__cxx11::string::~string(&in_stack_fffffffffffff320->name);
  return in_RDI;
}

Assistant:

std::string FederateState::processQueryActual(std::string_view query) const
{
    auto addHeader = [this](nlohmann::json& base) {
        nlohmann::json att = nlohmann::json::object();
        att["name"] = getIdentifier();
        att["id"] = global_id.load().baseValue();
        att["parent"] = mParent->getGlobalId().baseValue();
        base["attributes"] = att;
    };

    auto qres = generateInterfaceQueryResults(query, interfaceInformation, addHeader);
    if (!qres.empty()) {
        return qres;
    }
    if (query == "global_flush") {
        return "{\"status\":true}";
    }
    if (query == "subscriptions") {
        std::ostringstream subs;
        subs << "[";
        auto ipts = interfaceInformation.getInputs();
        for (const auto& ipt : ipts) {
            for (const auto& isrc : ipt->input_sources) {
                subs << isrc.fed_id << ':' << isrc.handle << ';';
            }
        }
        ipts.unlock();
        unlock();
        auto str = subs.str();
        if (str.back() == ';') {
            str.pop_back();
        }
        str.push_back(']');
        return str;
    }
    if (query == "dependencies") {
        return generateStringVector(timeCoord->getDependencies(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }
    if (query == "current_time") {
        return timeCoord->printTimeStatus();
    }
    if (query == "current_state") {
        nlohmann::json base;
        addHeader(base);
        base["state"] = fedStateString(state.load());
        base["publications"] = publicationCount();
        base["input"] = inputCount();
        base["endpoints"] = endpointCount();
        base["granted_time"] = static_cast<double>(grantedTime());
        return fileops::generateJsonString(base);
    }
    if (query == "barriers") {
        nlohmann::json base;
        addHeader(base);

        base["barriers"] = nlohmann::json::array();
        for (const auto& barrier : timeCoord->getBarriers()) {
            nlohmann::json br1 = nlohmann::json::object();
            br1["id"] = barrier.second;
            br1["time"] = static_cast<double>(barrier.first);
            base["barriers"].push_back(std::move(br1));
        }
        return fileops::generateJsonString(base);
    }
    if (query == "global_state") {
        nlohmann::json base;
        addHeader(base);
        base["state"] = fedStateString(state.load());
        return fileops::generateJsonString(base);
    }
    if (query == "global_time_debugging") {
        nlohmann::json base;
        addHeader(base);
        base["federate_state"] = fedStateString(state.load());
        base["granted_mode"] = timeGranted_mode;
        if (!timeCoord->empty()) {
            timeCoord->generateDebuggingTimeInfo(base);
        }
        return fileops::generateJsonString(base);
    }
    if (query == "timeconfig") {
        nlohmann::json base;
        timeCoord->generateConfig(base);
        generateConfig(base);
        return fileops::generateJsonString(base);
    }
    if (query == "config") {
        nlohmann::json base;
        timeCoord->generateConfig(base);
        generateConfig(base);
        interfaceInformation.generateInferfaceConfig(base);
        addFederateTags(base, this);
        return fileops::generateJsonString(base);
    }
    if (query == "unconnected_interfaces") {
        nlohmann::json base;
        addHeader(base);
        interfaceInformation.getUnconnectedInterfaces(base);

        if (!tags.empty()) {
            nlohmann::json tagBlock = nlohmann::json::object();
            for (const auto& tag : tags) {
                tagBlock[tag.first] = tag.second;
            }
            base["tags"] = tagBlock;
        }
        if (!queryCallbacks.empty()) {
            for (const auto& queryCallback : queryCallbacks) {
                if (!queryCallback) {
                    continue;
                }
                auto potential = queryCallback("potential_interfaces");
                if (!potential.empty()) {
                    try {
                        auto json = fileops::loadJsonStr(potential);

                        if (!json.contains("error")) {
                            base["potential_interfaces"] = json;
                            break;
                        }
                    }
                    catch (const std::invalid_argument&) {
                        ;
                    }
                }
            }
        }
        return fileops::generateJsonString(base);
    }
    if (query == "tags") {
        nlohmann::json tagBlock = nlohmann::json::object();
        for (const auto& tag : tags) {
            tagBlock[tag.first] = tag.second;
        }
        return fileops::generateJsonString(tagBlock);
    }
    if (query.compare(0, 4, "tag/") == 0) {
        std::string_view keyTag = query;
        keyTag.remove_prefix(4);
        for (const auto& tag : tags) {
            if (keyTag == tag.first) {
                return generateJsonQuotedString(tag.second);
            }
        }
        return "\"\"";
    }
    if (query == "dependents") {
        return generateStringVector(timeCoord->getDependents(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }
    if (query == "logs") {
        nlohmann::json base;
        addHeader(base);
        bufferToJson(mLogManager->getLogBuffer(), base);
        return fileops::generateJsonString(base);
    }
    if (query == "data_flow_graph") {
        nlohmann::json base;
        addHeader(base);
        interfaceInformation.generateDataFlowGraph(base);
        return fileops::generateJsonString(base);
    }
    if (query == "global_time" || query == "global_status") {
        nlohmann::json base;
        addHeader(base);
        base["granted_time"] = static_cast<double>(timeCoord->getGrantedTime());
        base["send_time"] = static_cast<double>(timeCoord->allowedSendTime());
        return fileops::generateJsonString(base);
    }
    if (query == "dependency_graph") {
        nlohmann::json base;
        addHeader(base);
        base["dependents"] = nlohmann::json::array();
        for (auto& dep : timeCoord->getDependents()) {
            base["dependents"].push_back(dep.baseValue());
        }
        base["dependencies"] = nlohmann::json::array();
        for (auto& dep : timeCoord->getDependencies()) {
            base["dependencies"].push_back(dep.baseValue());
        }
        return fileops::generateJsonString(base);
    }

    if (!queryCallbacks.empty()) {
        for (const auto& queryCallback : queryCallbacks) {
            if (!queryCallback) {
                continue;
            }
            auto val = queryCallback(query);
            if (!val.empty()) {
                return val;
            }
        }
    }
    // check existingTag value for a matching string
    for (const auto& tag : tags) {
        if (tag.first == query) {
            return generateJsonQuotedString(tag.second);
        }
    }
    return generateJsonErrorResponse(JsonErrorCodes::BAD_REQUEST, "unrecognized Federate query");
}